

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacWriteBlif.c
# Opt level: O0

void Bac_ManWriteBlifGate(FILE *pFile,Bac_Ntk_t *p,Mio_Gate_t *pGate,Vec_Int_t *vFanins,int iObj)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  int local_34;
  int i;
  int iFanin;
  int iObj_local;
  Vec_Int_t *vFanins_local;
  Mio_Gate_t *pGate_local;
  Bac_Ntk_t *p_local;
  FILE *pFile_local;
  
  for (local_34 = 0; iVar1 = Vec_IntSize(vFanins), local_34 < iVar1; local_34 = local_34 + 1) {
    iVar1 = Vec_IntEntry(vFanins,local_34);
    pcVar2 = Mio_GateReadPinName(pGate,local_34);
    pcVar3 = Bac_ObjNameStr(p,iVar1);
    fprintf((FILE *)pFile," %s=%s",pcVar2,pcVar3);
  }
  pcVar2 = Mio_GateReadOutName(pGate);
  pcVar3 = Bac_ObjNameStr(p,iObj);
  fprintf((FILE *)pFile," %s=%s",pcVar2,pcVar3);
  fprintf((FILE *)pFile,"\n");
  return;
}

Assistant:

void Bac_ManWriteBlifGate( FILE * pFile, Bac_Ntk_t * p, Mio_Gate_t * pGate, Vec_Int_t * vFanins, int iObj )
{
    int iFanin, i;
    Vec_IntForEachEntry( vFanins, iFanin, i )
        fprintf( pFile, " %s=%s", Mio_GateReadPinName(pGate, i), Bac_ObjNameStr(p, iFanin) );
    fprintf( pFile, " %s=%s", Mio_GateReadOutName(pGate), Bac_ObjNameStr(p, iObj) );
    fprintf( pFile, "\n" );
}